

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O0

void __thiscall QDnsLookupReply::makeInvalidReplyError(QDnsLookupReply *this,QString *msg)

{
  long lVar1;
  bool bVar2;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_fffffffffffffe78;
  int n;
  QDnsLookupReply *pQVar3;
  Error err;
  QString *in_stack_fffffffffffffe80;
  QDnsLookupReply *this_00;
  char *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  int fieldWidth;
  QChar local_142 [8];
  QChar in_stack_fffffffffffffece;
  
  fieldWidth = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QString::isEmpty((QString *)0x36574a);
  n = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  if (bVar2) {
    QDnsLookup::tr(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,n);
    QString::operator=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    QString::~QString((QString *)0x365783);
  }
  else {
    QDnsLookup::tr(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,n);
    QChar::QChar<char16_t,_true>(local_142,L' ');
    QString::arg<QString,_true>(in_RDI,in_RSI,fieldWidth,in_stack_fffffffffffffece);
    QString::operator=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    QString::~QString((QString *)0x3657ed);
    QString::~QString((QString *)0x3657f7);
  }
  pQVar3 = (QDnsLookupReply *)0x0;
  this_00 = (QDnsLookupReply *)0x0;
  QDnsLookupReply((QDnsLookupReply *)0x0);
  operator=(this_00,pQVar3);
  err = (Error)((ulong)pQVar3 >> 0x20);
  ~QDnsLookupReply(this_00);
  setError(this_00,err,(QString *)0x3658b5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void makeInvalidReplyError(QString &&msg = QString())
    {
        if (msg.isEmpty())
            msg = QDnsLookup::tr("Invalid reply received");
        else
            msg = QDnsLookup::tr("Invalid reply received (%1)").arg(std::move(msg));
        *this = QDnsLookupReply();  // empty our lists
        setError(QDnsLookup::InvalidReplyError, std::move(msg));
    }